

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O0

ostream * Gudhi::Persistence_representations::operator<<(ostream *out,Persistence_landscape *land)

{
  double dVar1;
  int iVar2;
  size_type sVar3;
  ostream *poVar4;
  reference pvVar5;
  reference pvVar6;
  void *this;
  size_type local_28;
  size_t i;
  size_t level;
  Persistence_landscape *land_local;
  ostream *out_local;
  
  for (i = 0; sVar3 = std::
                      vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ::size(&land->land), i != sVar3; i = i + 1) {
    poVar4 = std::operator<<(out,"Lambda_");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,i);
    poVar4 = std::operator<<(poVar4,":");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_28 = 0;
    while( true ) {
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&land->land,i);
      sVar3 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size(pvVar5);
      if (local_28 == sVar3) break;
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&land->land,i);
      pvVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](pvVar5,local_28);
      dVar1 = pvVar6->first;
      iVar2 = std::numeric_limits<int>::max();
      if ((dVar1 != (double)-iVar2) || (NAN(dVar1) || NAN((double)-iVar2))) {
        pvVar5 = std::
                 vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ::operator[](&land->land,i);
        pvVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](pvVar5,local_28);
        dVar1 = pvVar6->first;
        iVar2 = std::numeric_limits<int>::max();
        if ((dVar1 != (double)iVar2) || (NAN(dVar1) || NAN((double)iVar2))) {
          pvVar5 = std::
                   vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ::operator[](&land->land,i);
          pvVar6 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](pvVar5,local_28);
          std::ostream::operator<<(out,pvVar6->first);
        }
        else {
          std::operator<<(out,"+inf");
        }
      }
      else {
        std::operator<<(out,"-inf");
      }
      poVar4 = std::operator<<(out," , ");
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&land->land,i);
      pvVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](pvVar5,local_28);
      this = (void *)std::ostream::operator<<(poVar4,pvVar6->second);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      local_28 = local_28 + 1;
    }
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, Persistence_landscape& land) {
  for (size_t level = 0; level != land.land.size(); ++level) {
    out << "Lambda_" << level << ":" << std::endl;
    for (size_t i = 0; i != land.land[level].size(); ++i) {
      if (land.land[level][i].first == -std::numeric_limits<int>::max()) {
        out << "-inf";
      } else {
        if (land.land[level][i].first == std::numeric_limits<int>::max()) {
          out << "+inf";
        } else {
          out << land.land[level][i].first;
        }
      }
      out << " , " << land.land[level][i].second << std::endl;
    }
  }
  return out;
}